

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O0

double __thiscall Belief::InnerProduct(Belief *this,vector<double,_std::allocator<double>_> *values)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint s;
  double x;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10));
    if (local_1c == sVar2) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(ulong)local_1c);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)local_1c);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = vVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pvVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_18;
    auVar4 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
    local_18 = auVar4._0_8_;
    local_1c = local_1c + 1;
  }
  return local_18;
}

Assistant:

double Belief::InnerProduct(const vector<double> &values) const
{
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif

    double x=0;
    for(unsigned int s=0; s!=_m_b.size(); ++s)
        x+=_m_b[s]*values[s];

    return(x);
}